

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_15c76d4::AV1FwdTxfm2dTest_DCTScaleTest_Test::TestBody
          (AV1FwdTxfm2dTest_DCTScaleTest_Test *this)

{
  TX_SIZE tx_size;
  int src_stride;
  int j_1;
  int j;
  ulong uVar1;
  long lVar2;
  pointer *__ptr;
  SEARCH_METHODS *message;
  AssertionResult gtest_ar;
  int16_t src_diff [1024];
  tran_low_t coeff [1024];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffe780;
  char in_stack_ffffffffffffe788;
  undefined7 in_stack_ffffffffffffe789;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffe790;
  AssertHelper local_1868;
  double in_stack_ffffffffffffe7a0;
  double in_stack_ffffffffffffe7a8;
  double in_stack_ffffffffffffe7b0;
  tran_low_t local_1060 [1036];
  
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    tx_size = (&DAT_00b54ea6)[lVar2];
    src_stride = (&DAT_00b53c90)[lVar2];
    for (uVar1 = 0; (uint)(src_stride * src_stride) != uVar1; uVar1 = uVar1 + 1) {
      *(undefined2 *)(&stack0xffffffffffffe7a0 + uVar1 * 2) = 8;
      local_1060[uVar1] = 0;
    }
    av1_quick_txfm(0,tx_size,(BitDepthInfo)0x8,(int16_t *)&stack0xffffffffffffe7a0,src_stride,
                   local_1060);
    for (uVar1 = 0; (uint)(src_stride * src_stride) != uVar1; uVar1 = uVar1 + 1) {
    }
    testing::internal::DoubleNearPredFormat
              ((char *)CONCAT71(in_stack_ffffffffffffe789,in_stack_ffffffffffffe788),
               (char *)in_stack_ffffffffffffe780._M_head_impl,
               (char *)in_stack_ffffffffffffe790._M_head_impl,in_stack_ffffffffffffe7b0,
               in_stack_ffffffffffffe7a8,in_stack_ffffffffffffe7a0);
    if (in_stack_ffffffffffffe788 == '\0') {
      testing::Message::Message((Message *)&stack0xffffffffffffe780);
      message = "";
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )in_stack_ffffffffffffe790._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        message = *(SEARCH_METHODS **)in_stack_ffffffffffffe790._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1868,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_fwd_txfm2d_test.cc"
                 ,0x192,(char *)message);
      testing::internal::AssertHelper::operator=(&local_1868,(Message *)&stack0xffffffffffffe780);
      testing::internal::AssertHelper::~AssertHelper(&local_1868);
      if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
           )in_stack_ffffffffffffe780._M_head_impl !=
          (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        (**(code **)(*(long *)in_stack_ffffffffffffe780._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&stack0xffffffffffffe790);
  }
  return;
}

Assistant:

TEST(AV1FwdTxfm2dTest, DCTScaleTest) {
  BitDepthInfo bd_info;
  bd_info.bit_depth = 8;
  bd_info.use_highbitdepth_buf = 0;
  DECLARE_ALIGNED(32, int16_t, src_diff[1024]);
  DECLARE_ALIGNED(32, tran_low_t, coeff[1024]);

  const TX_SIZE tx_size_list[4] = { TX_4X4, TX_8X8, TX_16X16, TX_32X32 };
  const int stride_list[4] = { 4, 8, 16, 32 };
  const int ref_scale_list[4] = { 64, 64, 64, 16 };

  for (int i = 0; i < 4; i++) {
    TX_SIZE tx_size = tx_size_list[i];
    int stride = stride_list[i];
    int array_size = stride * stride;

    for (int j = 0; j < array_size; j++) {
      src_diff[j] = 8;
      coeff[j] = 0;
    }

    av1_quick_txfm(/*use_hadamard=*/0, tx_size, bd_info, src_diff, stride,
                   coeff);

    double input_sse = 0;
    double output_sse = 0;
    for (int j = 0; j < array_size; j++) {
      input_sse += pow(src_diff[j], 2);
      output_sse += pow(coeff[j], 2);
    }

    double scale = output_sse / input_sse;

    EXPECT_NEAR(scale, ref_scale_list[i], 5);
  }
}